

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIFont::setMaxHeight(CGUIFont *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  
  if (this->SpriteBank != (IGUISpriteBank *)0x0) {
    this->MaxHeight = 0;
    iVar2 = (**this->SpriteBank->_vptr_IGUISpriteBank)();
    lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
    uVar3 = (ulong)(((long *)CONCAT44(extraout_var,iVar2))[1] - lVar1) >> 4;
    if ((int)uVar3 != 0) {
      iVar2 = this->MaxHeight;
      uVar3 = uVar3 & 0xffffffff;
      piVar4 = (int *)(lVar1 + 0xc);
      do {
        iVar5 = *piVar4 - piVar4[-2];
        if (iVar2 < iVar5) {
          this->MaxHeight = iVar5;
          iVar2 = iVar5;
        }
        piVar4 = piVar4 + 4;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

void CGUIFont::setMaxHeight()
{
	if (!SpriteBank)
		return;

	MaxHeight = 0;

	core::array<core::rect<s32>> &p = SpriteBank->getPositions();

	for (u32 i = 0; i < p.size(); ++i) {
		const s32 t = p[i].getHeight();
		if (t > MaxHeight)
			MaxHeight = t;
	}
}